

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_DigestKey(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject)

{
  char cVar1;
  CK_BBOOL CVar2;
  CK_BBOOL isPrivateObject;
  int iVar3;
  Type TVar4;
  Session *this_00;
  Token *this_01;
  long *plVar5;
  CK_STATE sessionState;
  CK_RV CVar6;
  HashAlgorithm *pHVar7;
  size_t *in_RCX;
  uchar *in_R8;
  size_t in_R9;
  ByteString keybits;
  ByteString local_80;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar3 = Session::getOpType(this_00);
  if (iVar3 != 4) {
    return 0x91;
  }
  this_01 = Session::getToken(this_00);
  if (this_01 == (Token *)0x0) {
    return 5;
  }
  plVar5 = (long *)HandleManager::getObject(this->handleManager,hObject);
  if (plVar5 == (long *)0x0) {
    return 0x60;
  }
  cVar1 = (**(code **)(*plVar5 + 0x50))(plVar5);
  if (cVar1 == '\0') {
    return 0x60;
  }
  CVar2 = (**(code **)(*plVar5 + 0x20))(plVar5,1,0);
  isPrivateObject = (**(code **)(*plVar5 + 0x20))(plVar5,2,1);
  sessionState = Session::getState(this_00);
  CVar6 = haveRead(sessionState,CVar2,isPrivateObject);
  if (CVar6 != 0) {
    if (CVar6 != 0x101) {
      return 5;
    }
    softHSMLog(6,"C_DigestKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xee2,"User is not authorized");
    return 5;
  }
  TVar4 = Session::getHashAlgo(this_00);
  if (TVar4 - GOST < 0xfffffffb) {
    cVar1 = (**(code **)(*plVar5 + 0x20))(plVar5,0x162,0);
    if (cVar1 == '\0') {
      return 0x67;
    }
    cVar1 = (**(code **)(*plVar5 + 0x20))(plVar5,0x103,0);
    if (cVar1 != '\0') {
      return 0x67;
    }
  }
  cVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,0x11);
  if (cVar1 == '\0') {
    return 0x67;
  }
  ByteString::ByteString(&local_58);
  if (isPrivateObject == '\0') {
    (**(code **)(*plVar5 + 0x30))(&local_80,plVar5,0x11);
    ByteString::operator=(&local_58,&local_80);
    local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_80.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    (**(code **)(*plVar5 + 0x30))(&local_80,plVar5,0x11);
    iVar3 = Token::decrypt(this_01,(EVP_PKEY_CTX *)&local_80,(uchar *)&local_58,in_RCX,in_R8,in_R9);
    local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_80.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    CVar6 = 5;
    if ((char)iVar3 == '\0') goto LAB_00133b78;
  }
  pHVar7 = Session::getDigestOp(this_00);
  iVar3 = (*pHVar7->_vptr_HashAlgorithm[3])(pHVar7,&local_58);
  if ((char)iVar3 == '\0') {
    CVar6 = 5;
    Session::resetOp(this_00);
  }
  else {
    CVar6 = 0;
  }
LAB_00133b78:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar6;
}

Assistant:

CK_RV SoftHSM::C_DigestKey(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hObject);
	if (key == NULL_PTR || !key->isValid()) return CKR_KEY_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		// CKR_USER_NOT_LOGGED_IN is not a valid return code for this function,
		// so we use CKR_GENERAL_ERROR.
		return CKR_GENERAL_ERROR;
	}

	// Whitelist
	HashAlgo::Type algo = session->getHashAlgo();
	if (algo != HashAlgo::SHA1 &&
	    algo != HashAlgo::SHA224 &&
	    algo != HashAlgo::SHA256 &&
	    algo != HashAlgo::SHA384 &&
	    algo != HashAlgo::SHA512)
	{
		// Parano...
		if (!key->getBooleanValue(CKA_EXTRACTABLE, false))
			return CKR_KEY_INDIGESTIBLE;
		if (key->getBooleanValue(CKA_SENSITIVE, false))
			return CKR_KEY_INDIGESTIBLE;
	}

	// Get value
	if (!key->attributeExists(CKA_VALUE))
		return CKR_KEY_INDIGESTIBLE;
	ByteString keybits;
	if (isPrivate)
	{
		if (!token->decrypt(key->getByteStringValue(CKA_VALUE), keybits))
			return CKR_GENERAL_ERROR;
	}
	else
	{
		keybits = key->getByteStringValue(CKA_VALUE);
	}

	// Digest the value
	if (session->getDigestOp()->hashUpdate(keybits) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}